

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libclient.cpp
# Opt level: O0

string * __thiscall client::invoke(string *__return_storage_ptr__,client *this,string *request)

{
  allocator<char> local_b1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 local_a0 [8];
  message reply_message;
  string local_68 [32];
  undefined1 local_48 [8];
  message request_message;
  string *request_local;
  client *this_local;
  
  request_message.body_.field_2._8_8_ = request;
  std::__cxx11::string::string(local_68,(string *)request);
  message::message((message *)local_48,local_68);
  std::__cxx11::string::~string(local_68);
  message::message((message *)local_a0,(message *)local_48);
  message::body_abi_cxx11_((message *)local_a0);
  std::__cxx11::string::crbegin();
  message::body_abi_cxx11_((message *)local_a0);
  std::__cxx11::string::crend();
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,void>
            ((string *)__return_storage_ptr__,&local_a8,&local_b0,&local_b1);
  std::allocator<char>::~allocator(&local_b1);
  message::~message((message *)local_a0);
  message::~message((message *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string client::invoke(const std::string& request) {
    message request_message(request);
    // Invoke server here.
    const auto reply_message = request_message;
    return {reply_message.body().crbegin(), reply_message.body().crend()};
}